

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall
cmServer::WriteMessage(cmServer *this,cmServerRequest *request,string *message,string *title)

{
  ulong uVar1;
  Value *pVVar2;
  Value local_128;
  Value local_100;
  Value local_d8;
  Value local_b0;
  Value local_78;
  undefined1 local_50 [8];
  Value obj;
  string *title_local;
  string *message_local;
  cmServerRequest *request_local;
  cmServer *this_local;
  
  obj.limit_ = (size_t)title;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Json::Value::Value((Value *)local_50,objectValue);
    Json::Value::Value(&local_78,&kMESSAGE_TYPE_abi_cxx11_);
    pVVar2 = Json::Value::operator[]((Value *)local_50,&kTYPE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_78);
    Json::Value::~Value(&local_78);
    Json::Value::Value(&local_b0,&request->Type);
    pVVar2 = Json::Value::operator[]((Value *)local_50,&kREPLY_TO_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_b0);
    Json::Value::~Value(&local_b0);
    Json::Value::Value(&local_d8,&request->Cookie);
    pVVar2 = Json::Value::operator[]((Value *)local_50,&kCOOKIE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_d8);
    Json::Value::~Value(&local_d8);
    Json::Value::Value(&local_100,message);
    pVVar2 = Json::Value::operator[]((Value *)local_50,&kMESSAGE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_100);
    Json::Value::~Value(&local_100);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      Json::Value::Value(&local_128,(string *)obj.limit_);
      pVVar2 = Json::Value::operator[]((Value *)local_50,&kTITLE_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar2,&local_128);
      Json::Value::~Value(&local_128);
    }
    WriteJsonObject(this,request->Connection,(Value *)local_50,(DebugInfo *)0x0);
    Json::Value::~Value((Value *)local_50);
  }
  return;
}

Assistant:

void cmServer::WriteMessage(const cmServerRequest& request,
                            const std::string& message,
                            const std::string& title) const
{
  if (message.empty()) {
    return;
  }

  Json::Value obj = Json::objectValue;
  obj[kTYPE_KEY] = kMESSAGE_TYPE;
  obj[kREPLY_TO_KEY] = request.Type;
  obj[kCOOKIE_KEY] = request.Cookie;
  obj[kMESSAGE_KEY] = message;
  if (!title.empty()) {
    obj[kTITLE_KEY] = title;
  }

  WriteJsonObject(request.Connection, obj, nullptr);
}